

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::expressionStatement(Parser *this)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar2;
  ptr<Expression> expr;
  undefined1 local_28 [24];
  
  expression((Parser *)&expr);
  consume(in_RSI,StatEnd,"\';\'");
  std::make_shared<ExpressionStatement,std::shared_ptr<Expression>&>
            ((shared_ptr<Expression> *)local_28);
  uVar1 = local_28._8_8_;
  local_28._8_8_ = 0;
  (this->filepath)._M_dataplus._M_p = (pointer)local_28._0_8_;
  (this->filepath)._M_string_length = uVar1;
  local_28._0_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar2.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::expressionStatement() {
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");
    return make<ExpressionStatement>(expr);
}